

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>::
~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>,_ProString>
                *this)

{
  ProString::~ProString((ProString *)0x226260);
  QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<ProString,_ProString>,_const_char_(&)[2]> *)0x22626a);
  return;
}

Assistant:

~QStringBuilder() = default;